

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void patchlistaux(FuncState *fs,int list,int vtarget,int reg,int dtarget)

{
  uint uVar1;
  int iVar2;
  int dest;
  int iVar3;
  
  if (list != -1) {
    do {
      uVar1 = fs->f->code[list] >> 7;
      iVar3 = list + -0xfffffe + uVar1;
      if (uVar1 == 0xfffffe) {
        iVar3 = -1;
      }
      iVar2 = patchtestreg(fs,list,reg);
      dest = vtarget;
      if (iVar2 == 0) {
        dest = dtarget;
      }
      fixjump(fs,list,dest);
      list = iVar3;
    } while (iVar3 != -1);
  }
  return;
}

Assistant:

static void patchlistaux (FuncState *fs, int list, int vtarget, int reg,
                          int dtarget) {
  while (list != NO_JUMP) {
    int next = getjump(fs, list);
    if (patchtestreg(fs, list, reg))
      fixjump(fs, list, vtarget);
    else
      fixjump(fs, list, dtarget);  /* jump to default target */
    list = next;
  }
}